

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp-test.cc
# Opt level: O0

void __thiscall SPTest_OrderVarsByStage_Test::TestBody(SPTest_OrderVarsByStage_Test *this)

{
  StringRef name;
  bool bVar1;
  Type TVar2;
  Type TVar3;
  int iVar4;
  int iVar5;
  int *expected;
  MutVariable MVar6;
  Variable VVar7;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  SPAdapter sp;
  AssertionResult gtest_ar;
  TestBasicProblem p;
  char *in_stack_fffffffffffff7e8;
  int in_stack_fffffffffffff7f0;
  int in_stack_fffffffffffff7f4;
  undefined4 uVar8;
  BasicProblem<mp::BasicProblemParams<int>_> *in_stack_fffffffffffff7f8;
  undefined4 in_stack_fffffffffffff800;
  undefined4 in_stack_fffffffffffff804;
  undefined4 in_stack_fffffffffffff808;
  int in_stack_fffffffffffff80c;
  int line;
  char *in_stack_fffffffffffff810;
  Type in_stack_fffffffffffff81c;
  Type type;
  undefined4 in_stack_fffffffffffff820;
  undefined4 in_stack_fffffffffffff824;
  Message *in_stack_fffffffffffff868;
  undefined4 in_stack_fffffffffffff870;
  undefined4 uVar9;
  AssertionResult local_730 [2];
  BasicProblem<mp::BasicProblemParams<int>_> *local_710;
  int local_708;
  BasicProblem<mp::BasicProblemParams<int>_> *local_700;
  int local_6f8;
  Type local_6f0;
  undefined4 local_6ec;
  AssertionResult local_6e8;
  int in_stack_fffffffffffff928;
  int in_stack_fffffffffffff92c;
  TestBasicProblem *in_stack_fffffffffffff930;
  ColProblem *in_stack_fffffffffffff948;
  undefined4 in_stack_fffffffffffff950;
  undefined4 in_stack_fffffffffffff954;
  AssertionResult local_6a0 [38];
  SuffixBase local_438;
  BasicProblem<mp::BasicProblemParams<int>_> *local_430;
  int local_428;
  BasicProblem<mp::BasicProblemParams<int>_> *local_420;
  int local_418;
  BasicProblem<mp::BasicProblemParams<int>_> *local_400;
  int local_3f8;
  BasicProblem<mp::BasicProblemParams<int>_> *local_3e0;
  int local_3d8;
  Type local_3d0;
  undefined4 local_3cc;
  AssertionResult local_3c8 [60];
  
  TestBasicProblem::TestBasicProblem
            (in_stack_fffffffffffff930,in_stack_fffffffffffff92c,in_stack_fffffffffffff928);
  local_3cc = 1;
  MVar6 = mp::BasicProblem<mp::BasicProblemParams<int>_>::var
                    ((BasicProblem<mp::BasicProblemParams<int>_> *)
                     CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800),
                     (int)((ulong)in_stack_fffffffffffff7f8 >> 0x20));
  local_400 = MVar6.
              super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_3f8 = MVar6.
              super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  local_3e0 = local_400;
  local_3d8 = local_3f8;
  TVar2 = mp::BasicProblem<mp::BasicProblemParams<int>_>::
          BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          ::type((BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
  local_3d0 = TVar2;
  testing::internal::EqHelper<false>::Compare<mp::var::Type,mp::var::Type>
            ((char *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),
             (char *)CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800),
             (Type *)in_stack_fffffffffffff7f8,
             (Type *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3c8);
  uVar9 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff870);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
    in_stack_fffffffffffff868 =
         (Message *)testing::AssertionResult::failure_message((AssertionResult *)0x11bba8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820),
               in_stack_fffffffffffff81c,in_stack_fffffffffffff810,in_stack_fffffffffffff80c,
               (char *)CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(TVar2,uVar9),in_stack_fffffffffffff868);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
    testing::Message::~Message((Message *)0x11bc0b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11bc63);
  MVar6 = mp::BasicProblem<mp::BasicProblemParams<int>_>::var
                    ((BasicProblem<mp::BasicProblemParams<int>_> *)
                     CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800),
                     (int)((ulong)in_stack_fffffffffffff7f8 >> 0x20));
  local_430 = MVar6.
              super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_428 = MVar6.
              super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  local_420 = local_430;
  local_418 = local_428;
  mp::BasicProblem<mp::BasicProblemParams<int>_>::MutVariable::set_lb
            ((MutVariable *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
             (double)in_stack_fffffffffffff7e8);
  fmt::BasicStringRef<char>::BasicStringRef
            ((BasicStringRef<char> *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
             in_stack_fffffffffffff7e8);
  name.data_._4_4_ = in_stack_fffffffffffff804;
  name.data_._0_4_ = in_stack_fffffffffffff800;
  name.size_._0_4_ = in_stack_fffffffffffff808;
  name.size_._4_4_ = in_stack_fffffffffffff80c;
  local_438.impl_ =
       (Impl *)mp::BasicProblem<mp::BasicProblemParams<int>_>::AddIntSuffix
                         (in_stack_fffffffffffff7f8,name,in_stack_fffffffffffff7f4,
                          in_stack_fffffffffffff7f0);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::SuffixHandler<int>::SetValue
            ((SuffixHandler<int> *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
             (int)((ulong)in_stack_fffffffffffff7e8 >> 0x20),(int)in_stack_fffffffffffff7e8);
  mp::SPAdapter::SPAdapter
            ((SPAdapter *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
             in_stack_fffffffffffff948);
  mp::SPAdapter::var((SPAdapter *)CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800),
                     (int)((ulong)in_stack_fffffffffffff7f8 >> 0x20));
  mp::BasicProblem<mp::BasicProblemParams<int>_>::
  BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  ::type((BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          *)0x11bdae);
  testing::internal::EqHelper<false>::Compare<mp::var::Type,mp::var::Type>
            ((char *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),
             (char *)CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800),
             (Type *)in_stack_fffffffffffff7f8,
             (Type *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_6a0);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
    testing::AssertionResult::failure_message((AssertionResult *)0x11be6e);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820),
               in_stack_fffffffffffff81c,in_stack_fffffffffffff810,in_stack_fffffffffffff80c,
               (char *)CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(TVar2,uVar9),in_stack_fffffffffffff868);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
    testing::Message::~Message((Message *)0x11becb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11bf23);
  local_6ec = 0;
  VVar7 = mp::SPAdapter::var((SPAdapter *)
                             CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800),
                             (int)((ulong)in_stack_fffffffffffff7f8 >> 0x20));
  local_710 = VVar7.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
              problem_;
  iVar4 = VVar7.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_
  ;
  local_708 = iVar4;
  local_700 = local_710;
  local_6f8 = iVar4;
  TVar3 = mp::BasicProblem<mp::BasicProblemParams<int>_>::
          BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          ::type((BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                  *)0x11bf8e);
  local_6f0 = TVar3;
  testing::internal::EqHelper<false>::Compare<mp::var::Type,mp::var::Type>
            ((char *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),
             (char *)CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800),
             (Type *)in_stack_fffffffffffff7f8,
             (Type *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
  iVar5 = (int)((ulong)in_stack_fffffffffffff7f8 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_6e8);
  type = CONCAT13(bVar1,(int3)in_stack_fffffffffffff81c);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(iVar4,TVar3));
    in_stack_fffffffffffff810 =
         testing::AssertionResult::failure_message((AssertionResult *)0x11c035);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(iVar4,TVar3),type,in_stack_fffffffffffff810,
               in_stack_fffffffffffff80c,
               (char *)CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(TVar2,uVar9),in_stack_fffffffffffff868);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
    testing::Message::~Message((Message *)0x11c092);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11c0ea);
  VVar7 = mp::SPAdapter::var((SPAdapter *)
                             CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800),iVar5);
  iVar5 = VVar7.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_
  ;
  uVar8 = VVar7.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
          problem_._0_4_;
  line = VVar7.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
         problem_._4_4_;
  expected = (int *)mp::BasicProblem<mp::BasicProblemParams<int>_>::
                    BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                    ::lb((BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                          *)0x11c155);
  testing::internal::EqHelper<false>::Compare<int,double>
            ((char *)CONCAT44(line,uVar8),(char *)CONCAT44(iVar5,in_stack_fffffffffffff800),expected
             ,(double *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_730);
  uVar8 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff7f4);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(iVar4,TVar3));
    testing::AssertionResult::failure_message((AssertionResult *)0x11c202);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(iVar4,TVar3),type,in_stack_fffffffffffff810,line,
               (char *)CONCAT44(iVar5,in_stack_fffffffffffff800));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(TVar2,uVar9),in_stack_fffffffffffff868);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(uVar8,in_stack_fffffffffffff7f0));
    testing::Message::~Message((Message *)0x11c25d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11c2b2);
  mp::SPAdapter::~SPAdapter((SPAdapter *)CONCAT44(uVar8,in_stack_fffffffffffff7f0));
  TestBasicProblem::~TestBasicProblem((TestBasicProblem *)0x11c2cc);
  return;
}

Assistant:

TEST(SPTest, OrderVarsByStage) {
  TestBasicProblem p(2, 1);
  EXPECT_EQ(mp::var::INTEGER, p.var(1).type());
  p.var(0).set_lb(42);
  p.AddIntSuffix("stage", mp::suf::VAR, 1).SetValue(0, 2);
  mp::SPAdapter sp(p);
  EXPECT_EQ(mp::var::INTEGER, sp.var(0).type());
  EXPECT_EQ(mp::var::CONTINUOUS, sp.var(1).type());
  EXPECT_EQ(42, sp.var(1).lb());
}